

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

bool __thiscall Bitmap::getPixelValue(Bitmap *this,int32_t pixel)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((uint)pixel < (uint)this->length) {
    iVar1 = pixel + 7;
    if (-1 < pixel) {
      iVar1 = pixel;
    }
    uVar2 = (uint)this->data[iVar1 >> 3];
  }
  return (bool)((byte)(uVar2 << ((byte)pixel & 7)) >> 7);
}

Assistant:

bool Bitmap::getPixelValue(const int32_t pixel)
{
   const int32_t index = pixel / 8;
   const uint8_t mask = (0x80 >> (pixel & 7));
   uint8_t data = 0;

   //ignore all pixel that does not fit onto the lable
   if ((uint32_t)pixel < this->length)
   {
      //read respective byte
      data = this->data[index];
   }
   return ((data & mask) != 0);
}